

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O0

NormalizationResult *
Kernel::normalizeMul<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (NormalizationResult *lhs,NormalizationResult *rhs,bool *simplified)

{
  RefIterator it;
  initializer_list<Kernel::PolyNf> factors;
  bool bVar1;
  Stack<Kernel::PolyNf> *pSVar2;
  Stack<Kernel::PolyNf> *pSVar3;
  int *r_00;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  NormalizationResult *in_RDI;
  PolyNf r_3;
  PolyNf l_3;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r_2;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l_2;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l_1;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r_1;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffd78;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffd80;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this;
  PolyNf *in_stack_fffffffffffffd88;
  Stack<Kernel::PolyNf> *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  undefined5 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda5;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  byte bVar4;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffdb0;
  iterator in_stack_fffffffffffffdb8;
  size_type in_stack_fffffffffffffdc0;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_fffffffffffffdd8;
  Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffde0;
  RenderPolyNf *in_stack_fffffffffffffde8;
  RenderPolyNf *this_00;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_200;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_1d0;
  undefined8 local_1c8;
  undefined4 local_120;
  byte local_119;
  undefined4 local_104;
  RefIterator local_f0;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_e0;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_d8;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_90;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_88;
  RenderPolyNf local_70 [64];
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_30;
  PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)CONCAT71(in_register_00000009,in_CL);
  bVar1 = Lib::
          Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
          ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                    ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      *)0x923474);
  if ((bVar1) &&
     (bVar1 = Lib::
              Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::is<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                        ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          *)0x92348a), bVar1)) {
    local_28 = Lib::
               Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
               ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                         ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                           *)0x9234a0);
    local_30 = Lib::
               Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
               ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                         ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                           *)0x9234b5);
    pSVar2 = Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
             ::operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0x9234ce);
    this_00 = local_70;
    Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)in_stack_fffffffffffffd80
               ,(Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                in_stack_fffffffffffffd78);
    RenderPolyNf::operator()
              (this_00,(Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)pSVar2);
    Lib::Stack<Kernel::PolyNf>::push(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
              ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x92352a);
    Lib::
    Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
    ::Coproduct(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  else {
    bVar1 = Lib::
            Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
            ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                      ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                        *)0x923574);
    if ((bVar1) &&
       (bVar1 = Lib::
                Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                ::is<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                          ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                            *)0x92358a), bVar1)) {
      local_88 = Lib::
                 Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                 ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                           ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                             *)0x9235a0);
      local_90 = Lib::
                 Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                 ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                           ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                             *)0x9235b5);
      Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x9235ce);
      Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
                ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 in_stack_fffffffffffffd80,
                 (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 in_stack_fffffffffffffd78);
      RenderPolyNf::operator()
                (in_stack_fffffffffffffde8,
                 (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                 in_stack_fffffffffffffde0);
      Lib::Stack<Kernel::PolyNf>::push(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
                ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x92362a);
      Lib::
      Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ::Coproduct(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
    else {
      bVar1 = Lib::
              Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                        ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          *)0x923674);
      if ((bVar1) &&
         (bVar1 = Lib::
                  Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                  ::is<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                            ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              *)0x92368a), bVar1)) {
        local_d8 = Lib::
                   Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                   ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                             ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                               *)0x9236a0);
        local_e0 = Lib::
                   Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
                   ::unwrap<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                             ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                               *)0x9236b5);
        pSVar2 = Lib::
                 Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                 operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x9236ce);
        pSVar3 = Lib::
                 Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                 operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x9236e4);
        r_00 = (int *)Lib::Stack<Kernel::PolyNf>::size(pSVar3);
        pSVar3 = Lib::
                 Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
                 operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                             *)0x923702);
        Lib::Stack<Kernel::PolyNf>::size(pSVar3);
        Lib::Stack<Kernel::PolyNf>::reserve
                  ((Stack<Kernel::PolyNf> *)
                   CONCAT17(in_stack_fffffffffffffda7,
                            CONCAT16(in_stack_fffffffffffffda6,
                                     CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)))
                   ,in_stack_fffffffffffffd98);
        Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x92372d);
        Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x923743);
        local_f0 = Lib::Stack<Kernel::PolyNf>::iter((Stack<Kernel::PolyNf> *)0x92374b);
        it._stack._0_5_ = in_stack_fffffffffffffda0;
        it._pointer = (PolyNf *)in_stack_fffffffffffffd98;
        it._stack._5_1_ = in_stack_fffffffffffffda5;
        it._stack._6_1_ = in_stack_fffffffffffffda6;
        it._stack._7_1_ = in_stack_fffffffffffffda7;
        Lib::Stack<Kernel::PolyNf>::loadFromIterator<Lib::Stack<Kernel::PolyNf>::RefIterator>
                  (in_stack_fffffffffffffd90,it);
        IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)in_stack_fffffffffffffd90,
                   (IntegerConstantType *)in_stack_fffffffffffffd88);
        local_104 = 1;
        local_119 = 0;
        bVar1 = operator!=((IntegerConstantType *)pSVar2,r_00);
        bVar4 = false;
        if (bVar1) {
          IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)in_stack_fffffffffffffd90,
                     (IntegerConstantType *)in_stack_fffffffffffffd88);
          local_119 = 1;
          local_120 = 1;
          bVar4 = operator!=((IntegerConstantType *)pSVar2,r_00);
        }
        if ((local_119 & 1) != 0) {
          IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x92383b);
        }
        IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x923848);
        if ((bVar4 & 1) != 0) {
          *local_20 = 1;
        }
        IntegerConstantType::operator*=
                  ((IntegerConstantType *)in_stack_fffffffffffffd80,
                   (IntegerConstantType *)in_stack_fffffffffffffd78);
        Lib::
        Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ::Coproduct(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      }
      else {
        Lib::
        Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
        ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                  ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    *)0x9238ef);
        Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
                  ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffd80,
                   (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffd78);
        RenderPolyNf::operator()
                  (in_stack_fffffffffffffde8,
                   (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffde0);
        Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
                  ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x92392d);
        Lib::
        Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>
        ::unwrap<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
                  ((Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    *)0x92393a);
        Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
                  ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffd80,
                   (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffd78);
        RenderPolyNf::operator()
                  (in_stack_fffffffffffffde8,
                   (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   in_stack_fffffffffffffde0);
        Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
                  ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x923978);
        this = &local_200;
        PolyNf::PolyNf((PolyNf *)this,(PolyNf *)in_stack_fffffffffffffd78);
        PolyNf::PolyNf((PolyNf *)this,(PolyNf *)in_stack_fffffffffffffd78);
        local_1c8 = 2;
        factors._M_len = in_stack_fffffffffffffdc0;
        factors._M_array = in_stack_fffffffffffffdb8;
        local_1d0 = this;
        PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::PreMonom
                  (in_stack_fffffffffffffdb0,factors);
        Lib::
        Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ::Coproduct<Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_0>
                  (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~PreMonom(this);
      }
    }
  }
  return in_RDI;
}

Assistant:

NormalizationResult normalizeMul(NormalizationResult& lhs, NormalizationResult& rhs, bool& simplified) {
  using Polynom      = Polynom<NumTraits>;
  using PreMonom     = PreMonom<NumTraits>;
  ASS(lhs.is<Polynom>() || lhs.is<PreMonom>())
  ASS(rhs.is<Polynom>() || rhs.is<PreMonom>())

  if (lhs.is<PreMonom>() && rhs.is<Polynom>())  {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<Polynom>();
    /* Monom(x0, x1, ...) * Polynom(...) ==> Monom(x0, x1, ..., Polynom(...)) */
    l.factors->push(RenderPolyNf{}(std::move(r)));
    return std::move(lhs);

    // rhs.raw().push(toNormalizedMonom(std::move(lhs)));
    // return std::move(rhs);

  } else if (rhs.is<PreMonom>() && lhs.is<Polynom>()){
    auto& r = rhs.unwrap<PreMonom>();
    auto& l = lhs.unwrap<Polynom>();
    /* Polynom(...) * Monom(x0, x1, ...) ==> Monom(x0, x1, ..., Polynom(...)) */
    r.factors->push(RenderPolyNf{}(std::move(l)));
    return std::move(rhs);

    // lhs.raw().push(toNormalizedMonom(std::move(rhs)));
    // return std::move(lhs);

  } else if (lhs.is<PreMonom>() && rhs.is<PreMonom>()) {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<PreMonom>();

    /* Monom(x0, x1, ...) * Monom(y0, y1, ...) ==> Monom(x0, x1, ..., y0, y1, ...) */
    l.factors->reserve(l.factors->size() + r.factors->size());
    l.factors->loadFromIterator(r.factors->iter());
    if (l.numeral != 1 && r.numeral != 1) {
      simplified = true;
    }
    l.numeral *= r.numeral;
    return std::move(lhs);

  } else{
    ASS(lhs.is<Polynom>())
    ASS(rhs.is<Polynom>())
    auto l = RenderPolyNf{}(std::move(lhs.unwrap<Polynom>()));
    auto r = RenderPolyNf{}(std::move(rhs.unwrap<Polynom>()));

    /* Polynom(x0, x1, ...) * Polynom(y0, y1, ...) ==> Monom(Polynom(x0, x1, ...), Polynom(y0, y1, ...)) */

    return NormalizationResult(PreMonom({ l, r }));
  }
}